

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cap.cc
# Opt level: O1

void __thiscall S2Cap::AddPoint(S2Cap *this,S2Point *p)

{
  double dVar1;
  VType VVar2;
  bool bVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  S1ChordAngle local_38;
  S2LogMessage local_30;
  
  bVar3 = S2::IsUnitLength(p);
  if (!bVar3) {
    S2LogMessage::S2LogMessage
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cap.cc"
               ,0x55,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_30.stream_,"Check failed: S2::IsUnitLength(p) ",0x22);
    if (!bVar3) {
      abort();
    }
  }
  if (0.0 < (this->radius_).length2_ || (this->radius_).length2_ == 0.0) {
    S1ChordAngle::S1ChordAngle(&local_38,&this->center_,p);
    uVar4 = SUB84(local_38.length2_,0);
    uVar5 = (undefined4)((ulong)local_38.length2_ >> 0x20);
    dVar1 = (this->radius_).length2_;
    if (local_38.length2_ <= dVar1) {
      uVar4 = SUB84(dVar1,0);
      uVar5 = (undefined4)((ulong)dVar1 >> 0x20);
    }
  }
  else {
    (this->center_).c_[2] = p->c_[2];
    VVar2 = p->c_[1];
    (this->center_).c_[0] = p->c_[0];
    (this->center_).c_[1] = VVar2;
    S1ChordAngle::S1ChordAngle(&local_38,0.0);
    uVar4 = SUB84(local_38.length2_,0);
    uVar5 = (undefined4)((ulong)local_38.length2_ >> 0x20);
  }
  (this->radius_).length2_ = (double)CONCAT44(uVar5,uVar4);
  return;
}

Assistant:

void S2Cap::AddPoint(const S2Point& p) {
  // Compute the squared chord length, then convert it into a height.
  S2_DCHECK(S2::IsUnitLength(p));
  if (is_empty()) {
    center_ = p;
    radius_ = S1ChordAngle::Zero();
  } else {
    // After calling cap.AddPoint(p), cap.Contains(p) must be true.  However
    // we don't need to do anything special to achieve this because Contains()
    // does exactly the same distance calculation that we do here.
    radius_ = max(radius_, S1ChordAngle(center_, p));
  }
}